

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

Io_BlifMan_t * Io_BlifAlloc(void)

{
  Io_BlifMan_t *__s;
  Vec_Ptr_t *pVVar1;
  Io_BlifMan_t *p;
  
  __s = (Io_BlifMan_t *)malloc(0x298);
  memset(__s,0,0x298);
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vLines = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vInputs = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vOutputs = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vLatches = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vNames = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vTokens = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vPis = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vPos = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vLis = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vLos = pVVar1;
  return __s;
}

Assistant:

static Io_BlifMan_t * Io_BlifAlloc()
{
    Io_BlifMan_t * p;
    p = ABC_ALLOC( Io_BlifMan_t, 1 );
    memset( p, 0, sizeof(Io_BlifMan_t) );
    p->vLines   = Vec_PtrAlloc( 512 );
    p->vInputs  = Vec_PtrAlloc( 512 );
    p->vOutputs = Vec_PtrAlloc( 512 );
    p->vLatches = Vec_PtrAlloc( 512 );
    p->vNames   = Vec_PtrAlloc( 512 );
    p->vTokens  = Vec_PtrAlloc( 512 );
    p->vPis     = Vec_PtrAlloc( 512 );
    p->vPos     = Vec_PtrAlloc( 512 );
    p->vLis     = Vec_PtrAlloc( 512 );
    p->vLos     = Vec_PtrAlloc( 512 );
    return p;
}